

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom
          (Value_ImmediateValue *this,Value_ImmediateValue *from)

{
  ValueCase VVar1;
  LogMessage *other;
  TensorValue *this_00;
  TensorValue *from_00;
  TupleValue *this_01;
  TupleValue *from_01;
  ListValue *this_02;
  ListValue *from_02;
  DictionaryValue *this_03;
  DictionaryValue *from_03;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  Value_ImmediateValue *local_18;
  Value_ImmediateValue *from_local;
  Value_ImmediateValue *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x1599);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  VVar1 = value_case(local_18);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kTensor:
    this_00 = _internal_mutable_tensor(this);
    from_00 = _internal_tensor(local_18);
    TensorValue::MergeFrom(this_00,from_00);
    break;
  case kTuple:
    this_01 = _internal_mutable_tuple(this);
    from_01 = _internal_tuple(local_18);
    TupleValue::MergeFrom(this_01,from_01);
    break;
  case kList:
    this_02 = _internal_mutable_list(this);
    from_02 = _internal_list(local_18);
    ListValue::MergeFrom(this_02,from_02);
    break;
  case kDictionary:
    this_03 = _internal_mutable_dictionary(this);
    from_03 = _internal_dictionary(local_18);
    DictionaryValue::MergeFrom(this_03,from_03);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value_ImmediateValue::MergeFrom(const Value_ImmediateValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kTensor: {
      _internal_mutable_tensor()->::CoreML::Specification::MILSpec::TensorValue::MergeFrom(from._internal_tensor());
      break;
    }
    case kTuple: {
      _internal_mutable_tuple()->::CoreML::Specification::MILSpec::TupleValue::MergeFrom(from._internal_tuple());
      break;
    }
    case kList: {
      _internal_mutable_list()->::CoreML::Specification::MILSpec::ListValue::MergeFrom(from._internal_list());
      break;
    }
    case kDictionary: {
      _internal_mutable_dictionary()->::CoreML::Specification::MILSpec::DictionaryValue::MergeFrom(from._internal_dictionary());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}